

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::EntryAllSettled(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  JavascriptPromiseCapability *capabilities;
  Recycler *pRVar9;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements;
  RecyclableObject *this_01;
  JavascriptArray *values;
  RecyclableObject *nextFunc;
  JavascriptMethod p_Var10;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *pJVar11;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *pJVar12;
  RecyclableObject *this_02;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_f0 [8];
  AutoTagNativeLibraryEntry __tag;
  TrackAllocData data;
  ArgumentReader args;
  Var local_80;
  CallInfo local_78;
  CallInfo callInfo_local;
  uint32 local_3c;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_78 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1d8,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00ceded9;
    *puVar6 = 0;
  }
  data._32_8_ = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&data.line,&local_78);
  if ((local_78._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1d9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00ceded9;
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_f0,function,local_78,L"Promise.allSettled",
             &stack0x00000000);
  pvVar7 = Arguments::operator[]((Arguments *)&data.line,0);
  BVar5 = JavascriptOperators::IsObject(pvVar7);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec41,L"Promise.allSettled");
  }
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if ((data._32_8_ & 0xfffffe) == 0) {
    pRVar8 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&data.line,1);
  }
  capabilities = NewPromiseCapability(pvVar7,pSVar1);
  callInfo_local = (CallInfo)VarTo<Js::RecyclableObject>(pvVar7);
  __tag.entry.next =
       (Entry *)&JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7ba9e0c;
  data.filename._0_4_ = 0x203;
  pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)&__tag.entry.next);
  remainingElements =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
       new<Memory::Recycler>(4,pRVar9,0x56b216);
  remainingElements->remainingElements = 1;
  pRVar8 = JavascriptOperators::GetIterator(pRVar8,pSVar1,false);
  pvVar7 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)callInfo_local,0x134,pSVar1,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
  }
  this_01 = VarTo<Js::RecyclableObject>(pvVar7);
  values = JavascriptLibrary::CreateArray(this,0);
  local_80 = (Var)0x0;
  nextFunc = JavascriptOperators::CacheIteratorNext(pRVar8,pSVar1);
  local_3c = 0;
  while( true ) {
    bVar4 = JavascriptOperators::IteratorStepAndValue(pRVar8,pSVar1,nextFunc,&local_80);
    pvVar7 = local_80;
    if (!bVar4) break;
    this_00 = pSVar1->threadContext;
    bVar4 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint(this_01);
    CheckIsExecutable(this_01,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(this_01);
    pvVar7 = (*p_Var10)(this_01,(CallInfo)this_01,0x2000002,0,0,0,0,0x2000002,callInfo_local,pvVar7)
    ;
    this_00->reentrancySafeOrHandled = bVar4;
    __tag.entry.next =
         (Entry *)&JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_7ba9e0c;
    data.filename._0_4_ = 0x223;
    pRVar9 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)&__tag.entry.next);
    alreadyCalledWrapper =
         (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
         new<Memory::Recycler>(1,pRVar9,0x56b216);
    alreadyCalledWrapper->alreadyResolved = false;
    pJVar11 = JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction
                        (this,EntryAllSettledResolveOrRejectElementFunction,local_3c,values,
                         capabilities,remainingElements,alreadyCalledWrapper,false);
    pJVar12 = JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction
                        (this,EntryAllSettledResolveOrRejectElementFunction,local_3c,values,
                         capabilities,remainingElements,alreadyCalledWrapper,true);
    remainingElements->remainingElements = remainingElements->remainingElements + 1;
    BVar5 = JavascriptConversion::ToObject(pvVar7,pSVar1,(RecyclableObject **)&__tag.entry.next);
    if (BVar5 == 0) {
      hCode = -0x7ff5ec71;
LAB_00cedd72:
      JavascriptError::ThrowTypeError(pSVar1,hCode,(PCWSTR)0x0);
    }
    pvVar7 = JavascriptOperators::GetProperty
                       ((RecyclableObject *)__tag.entry.next,0x169,pSVar1,(PropertyValueInfo *)0x0);
    bVar4 = JavascriptConversion::IsCallable(pvVar7);
    if (!bVar4) {
      hCode = -0x7ff5ec76;
      goto LAB_00cedd72;
    }
    this_02 = VarTo<Js::RecyclableObject>(pvVar7);
    bVar4 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar1->threadContext);
    if (pSVar1->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint(this_02);
    CheckIsExecutable(this_02,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(this_02);
    (*p_Var10)(this_02,(CallInfo)this_02,0x2000003,0,0,0,0,0x2000003,__tag.entry.next,pJVar11,
               pJVar12);
    this_00->reentrancySafeOrHandled = bVar4;
    local_3c = local_3c + 1;
  }
  remainingElements->remainingElements = remainingElements->remainingElements - 1;
  if (remainingElements->remainingElements == 0) {
    if (values == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                  ,0x24a,"(values != nullptr)","values != nullptr");
      if (!bVar4) {
LAB_00ceded9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    TryCallResolveOrRejectHandler((capabilities->resolve).ptr,values,pSVar1);
  }
  pvVar2 = (capabilities->promise).ptr;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_f0);
  return pvVar2;
}

Assistant:

Var JavascriptPromise::EntryAllSettled(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.allSettled"));

        // 1. Let C be the this value.
        Var constructor = args[0];

        // 2. If Type(C) is not Object, throw a TypeError exception.
        if (!JavascriptOperators::IsObject(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.allSettled"));
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var iterable;

        if (args.Info.Count > 1)
        {
            iterable = args[1];
        }
        else
        {
            iterable = library->GetUndefined();
        }

        // 3. Let promiseCapability be NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(constructor, scriptContext);

        // We know that constructor is an object at this point - further, we even know that it is a constructor - because NewPromiseCapability
        // would throw otherwise. That means we can safely cast constructor into a RecyclableObject* now and avoid having to perform ToObject
        // as part of the Invoke operation performed inside the loop below.
        RecyclableObject* constructorObject = VarTo<RecyclableObject>(constructor);

        uint32 index = 0;
        JavascriptArray* values = nullptr;

        // We can't use a simple counter for the remaining element count since each Promise.all Resolve Element Function needs to know how many
        // elements are remaining when it runs and needs to update that counter for all other functions created by this call to Promise.all.
        // We can't just use a static variable, either, since this element count is only used for the Promise.all Resolve Element Functions created
        // by this call to Promise.all.
        JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
        remainingElementsWrapper->remainingElements = 1;

        JavascriptExceptionObject* exception = nullptr;
        try
        {
            // 4. Let iterator be GetIterator(iterable).
            RecyclableObject* iterator = JavascriptOperators::GetIterator(iterable, scriptContext);

            // Abstract operation PerformPromiseAllSettled
            Var resolveVar = JavascriptOperators::GetProperty(constructorObject, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }

            RecyclableObject* resolveFunc = VarTo<RecyclableObject>(resolveVar);
            values = library->CreateArray(0);

            JavascriptOperators::DoIteratorStepAndValue(iterator, scriptContext, [&](Var next)
            {
                ThreadContext* threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                        resolveFunc, Js::CallInfo(CallFlags_Value, 2),
                        constructorObject,
                        next);
                }
                END_SAFE_REENTRANT_CALL

                JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
                alreadyCalledWrapper->alreadyResolved = false;
                Var resolveElement = library->CreatePromiseAllSettledResolveOrRejectElementFunction(EntryAllSettledResolveOrRejectElementFunction, index, values, promiseCapability, remainingElementsWrapper, alreadyCalledWrapper, false);
                Var rejectElement = library->CreatePromiseAllSettledResolveOrRejectElementFunction(EntryAllSettledResolveOrRejectElementFunction, index, values, promiseCapability, remainingElementsWrapper, alreadyCalledWrapper, true);

                remainingElementsWrapper->remainingElements++;

                RecyclableObject* nextPromiseObject;

                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }

                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);

                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = VarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(scriptContext->GetThreadContext(),
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        resolveElement,
                        rejectElement);
                }
                END_SAFE_REENTRANT_CALL

                index++;
            });

            remainingElementsWrapper->remainingElements--;
            if (remainingElementsWrapper->remainingElements == 0)
            {
                Assert(values != nullptr);

                TryCallResolveOrRejectHandler(promiseCapability->GetResolve(), values, scriptContext);
            }
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }